

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void mxx::custom_op<int>::custom_function<int(*)(int,int)>
               (_func_int_int_int *func,void *invec,void *inoutvec,int *len,MPI_Datatype *dt)

{
  size_t __n;
  int iVar1;
  int i;
  long lVar2;
  int inout_buf;
  int in_buf;
  MPI_Aint true_extent;
  MPI_Aint true_lb;
  int local_48;
  int local_44;
  size_t local_40;
  long local_38;
  
  if (1 < *len) {
    lVar2 = 0;
    do {
      iVar1 = (*func)(*(int *)((long)invec + lVar2 * 4),*(int *)((long)inoutvec + lVar2 * 4));
      *(int *)((long)inoutvec + lVar2 * 4) = iVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)*len + -1);
  }
  MPI_Type_get_true_extent(*dt,&local_38,&local_40);
  lVar2 = local_38;
  __n = local_40;
  iVar1 = *len;
  memcpy((void *)((long)&local_44 + local_38),(void *)((long)invec + (long)iVar1 * 4 + -4),local_40)
  ;
  memcpy((void *)((long)&local_48 + lVar2),(void *)((long)inoutvec + (long)iVar1 * 4 + -4),__n);
  local_48 = (*func)(local_44,local_48);
  memcpy((void *)((long)inoutvec + (long)*len * 4 + -4),(void *)((long)&local_48 + local_38),
         local_40);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }